

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CropResizeLayerParams::MergePartialFromCodedStream
          (CropResizeLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  bool bVar4;
  short extraout_AX;
  uint32 uVar5;
  int iVar6;
  SamplingMode *this_00;
  ulong extraout_RAX;
  BoxCoordinatesMode *this_01;
  ulong extraout_RAX_00;
  char cVar7;
  uint tag;
  ulong uVar8;
  float local_5c;
  uint8 **local_58;
  int local_50;
  int local_4c;
  SamplingMode **local_48;
  BoxCoordinatesMode **local_40;
  bool *local_38;
  
  local_58 = &input->buffer_end_;
  local_40 = &this->boxindicesmode_;
  local_48 = &this->mode_;
  local_38 = &this->normalizedcoordinates_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0021c769;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0021c769:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_0021c7d8_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 == '\b') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,10,input,&this->targetsize_);
      }
      else {
        if ((tag & 0xff) != 10) goto switchD_0021c7d8_default;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->targetsize_);
      }
      goto LAB_0021c7b1;
    case 2:
      MergePartialFromCodedStream();
      if (extraout_AX == 0) goto switchD_0021c7d8_default;
      iVar6 = 6;
      if (extraout_AX == 1) break;
      goto LAB_0021c7b9;
    case 3:
      if (cVar7 != '\x1a') goto switchD_0021c7d8_default;
      if (*local_48 == (SamplingMode *)0x0) {
        this_00 = (SamplingMode *)operator_new(0x18);
        SamplingMode::SamplingMode(this_00);
        *local_48 = this_00;
      }
      MergePartialFromCodedStream();
      iVar6 = local_4c;
      uVar8 = extraout_RAX;
joined_r0x0021c8ca:
      if ((uVar8 & 1) == 0) goto LAB_0021c7b9;
      break;
    case 4:
      if (cVar7 == '\"') {
        if (*local_40 == (BoxCoordinatesMode *)0x0) {
          this_01 = (BoxCoordinatesMode *)operator_new(0x18);
          BoxCoordinatesMode::BoxCoordinatesMode(this_01);
          *local_40 = this_01;
        }
        MergePartialFromCodedStream();
        iVar6 = local_50;
        uVar8 = extraout_RAX_00;
        goto joined_r0x0021c8ca;
      }
    default:
switchD_0021c7d8_default:
      iVar6 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
LAB_0021c7b1:
        if (bVar4 == false) {
LAB_0021c93c:
          iVar6 = 6;
        }
        else {
LAB_0021c7b9:
          iVar6 = 0;
        }
      }
      break;
    case 5:
      if (cVar7 != '-') goto switchD_0021c7d8_default;
      pfVar3 = (float *)input->buffer_;
      if (3 < *(int *)&input->buffer_end_ - (int)pfVar3) {
        local_5c = *pfVar3;
        input->buffer_ = (uint8 *)(pfVar3 + 1);
LAB_0021c873:
        this->spatialscale_ = local_5c;
        goto LAB_0021c7b9;
      }
      bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                        (input,(uint32 *)&local_5c);
      if (bVar4) goto LAB_0021c873;
      goto LAB_0021c93c;
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool CropResizeLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CropResizeLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated uint64 targetSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_targetsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 10u, input, this->mutable_targetsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool normalizedCoordinates = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &normalizedcoordinates_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamplingMode mode = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mode()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_boxindicesmode()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float spatialScale = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &spatialscale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CropResizeLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CropResizeLayerParams)
  return false;
#undef DO_
}